

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

_Bool jsondec_seqnext(jsondec *d,char end_ch)

{
  _Bool _Var1;
  char cVar2;
  
  _Var1 = d->is_first;
  d->is_first = false;
  jsondec_skipws(d);
  cVar2 = *d->ptr;
  if ((cVar2 != end_ch) && (_Var1 == false)) {
    jsondec_parselit(d,",");
  }
  return cVar2 != end_ch;
}

Assistant:

static bool jsondec_seqnext(jsondec* d, char end_ch) {
  bool is_first = d->is_first;
  d->is_first = false;
  jsondec_skipws(d);
  if (*d->ptr == end_ch) return false;
  if (!is_first) jsondec_parselit(d, ",");
  return true;
}